

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O1

int archive_write_add_filter_lzip(archive *_a)

{
  int iVar1;
  int iVar2;
  archive_write_filter *f;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_lzip");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    f = __archive_write_allocate_filter(_a);
    iVar2 = common_setup(f);
    if (iVar2 == 0) {
      f->code = 9;
      f->name = "lzip";
    }
  }
  return iVar2;
}

Assistant:

int
archive_write_add_filter_lzip(struct archive *_a)
{
	struct archive_write_filter *f;
	int r;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_lzip");
	f = __archive_write_allocate_filter(_a);
	r = common_setup(f);
	if (r == ARCHIVE_OK) {
		f->code = ARCHIVE_FILTER_LZIP;
		f->name = "lzip";
	}
	return (r);
}